

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fir1.cpp
# Opt level: O1

void __thiscall Fir1::getCoeff(Fir1 *this,double *coeff_data,uint number_of_taps)

{
  uint uVar1;
  out_of_range *this_00;
  
  if (number_of_taps < this->taps) {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range
              (this_00,"Fir1: target of getCoeff: too many weights to copy into target");
    __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  memcpy(coeff_data,this->coefficients,(ulong)this->taps << 3);
  uVar1 = this->taps;
  if (uVar1 < number_of_taps) {
    memset(coeff_data + uVar1,0,(ulong)(number_of_taps - uVar1) << 3);
    return;
  }
  return;
}

Assistant:

void Fir1::getCoeff(double* coeff_data, unsigned number_of_taps) const {
	
	if (number_of_taps < taps)
		throw std::out_of_range("Fir1: target of getCoeff: too many weights to copy into target");
 
	memcpy(coeff_data, coefficients, taps * sizeof(double));
	if (number_of_taps > taps)
		memset(&coeff_data[taps], 0, (number_of_taps - taps)*sizeof(double));
}